

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_read_pcm_frames_from_backend
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ulong uVar1;
  ma_result mVar2;
  ulong uVar3;
  ulong uVar4;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 framesReadThisIteration;
  ma_uint8 pDiscardBuffer [4096];
  ma_uint32 local_1050;
  ma_format local_104c;
  long local_1048;
  ma_uint64 *local_1040;
  undefined1 local_1038 [4104];
  
  if (pFramesOut != (void *)0x0) {
    mVar2 = (*(code *)**pDataSource)(pDataSource,pFramesOut,frameCount,pFramesRead);
    return mVar2;
  }
  mVar2 = ma_data_source_get_data_format
                    (pDataSource,&local_104c,&local_1050,(ma_uint32 *)0x0,(ma_channel *)0x0,0);
  if (mVar2 == MA_SUCCESS) {
    uVar4 = 0;
    uVar1 = 0x1000 / (ulong)(*(int *)(&DAT_001908a0 + (ulong)local_104c * 4) * local_1050);
    local_1040 = pFramesRead;
    do {
      uVar3 = frameCount - uVar4;
      if (frameCount < uVar4 || uVar3 == 0) {
        *local_1040 = uVar4;
        return MA_SUCCESS;
      }
      local_1048 = 0;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      mVar2 = (*(code *)**pDataSource)(pDataSource,local_1038,uVar3,&local_1048);
      uVar4 = uVar4 + local_1048;
    } while (mVar2 == MA_SUCCESS);
  }
  return mVar2;
}

Assistant:

static ma_result ma_data_source_read_pcm_frames_from_backend(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    MA_ASSERT(pDataSourceBase                 != NULL);
    MA_ASSERT(pDataSourceBase->vtable         != NULL);
    MA_ASSERT(pDataSourceBase->vtable->onRead != NULL);
    MA_ASSERT(pFramesRead != NULL);

    if (pFramesOut != NULL) {
        return pDataSourceBase->vtable->onRead(pDataSourceBase, pFramesOut, frameCount, pFramesRead);
    } else {
        /*
        No output buffer. Probably seeking forward. Read and discard. Can probably optimize this in terms of
        onSeek and onGetCursor, but need to keep in mind that the data source may not implement these functions.
        */
        ma_result result;
        ma_uint64 framesRead;
        ma_format format;
        ma_uint32 channels;
        ma_uint64 discardBufferCapInFrames;
        ma_uint8  pDiscardBuffer[4096];

        result = ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;
        }

        discardBufferCapInFrames = sizeof(pDiscardBuffer) / ma_get_bytes_per_frame(format, channels);

        framesRead = 0;
        while (framesRead < frameCount) {
            ma_uint64 framesReadThisIteration = 0;
            ma_uint64 framesToRead = frameCount - framesRead;
            if (framesToRead > discardBufferCapInFrames) {
                framesToRead = discardBufferCapInFrames;
            }

            result = pDataSourceBase->vtable->onRead(pDataSourceBase, pDiscardBuffer, framesToRead, &framesReadThisIteration);
            if (result != MA_SUCCESS) {
                return result;
            }

            framesRead += framesReadThisIteration;
        }

        *pFramesRead = framesRead;

        return MA_SUCCESS;
    }
}